

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O0

RpcValue __thiscall
miniros::master::Master::registerSubscriber
          (Master *this,string *caller_id,string *topic,string *type,string *caller_api,
          Connection *connection)

{
  bool bVar1;
  XmlRpcValue *this_00;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  undefined8 in_RDI;
  string *in_R9;
  RpcValue RVar2;
  XmlRpcSource *in_stack_00000008;
  ReturnStruct st;
  bool enabled;
  RequesterInfo requesterInfo;
  RpcValue *res;
  string *in_stack_000003c0;
  string *in_stack_000003c8;
  RequesterInfo *in_stack_000003d0;
  MasterHandler *in_stack_000003d8;
  undefined8 in_stack_fffffffffffffe08;
  Level level;
  RequesterInfo *in_stack_fffffffffffffe10;
  RequesterInfo *in_stack_fffffffffffffe18;
  LogLocation *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe28;
  RequesterInfo *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  int *rhs;
  LogLocation *in_stack_fffffffffffffe40;
  XmlRpcValue *in_stack_fffffffffffffe48;
  Level in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  uint uVar3;
  int local_158 [15];
  char local_11a;
  allocator<char> local_119;
  string local_118 [52];
  Error local_e4 [9];
  string local_c0 [120];
  
  level = (Level)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  RequesterInfo::RequesterInfo(in_stack_fffffffffffffe30);
  XmlRpc::XmlRpcSource::getfd(in_stack_00000008);
  local_e4[0] = RequesterInfo::assign
                          (in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->callerId,level);
  bVar1 = Error::operator_cast_to_bool(local_e4);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    uVar3 = in_stack_fffffffffffffe54;
    if (((console::g_initialized ^ 0xff) & 1) != 0) {
      console::initialize();
      uVar3 = in_stack_fffffffffffffe54;
    }
    if (((registerSubscriber::loc.initialized_ ^ 0xffU) & 1) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar3,in_stack_fffffffffffffe50),(char *)in_stack_fffffffffffffe48,
                 (allocator<char> *)in_stack_fffffffffffffe40);
      console::initializeLogLocation
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                 (Level)((ulong)in_stack_fffffffffffffe30 >> 0x20));
      ::std::__cxx11::string::~string(local_118);
      ::std::allocator<char>::~allocator(&local_119);
    }
    if (registerSubscriber::loc.level_ != Warn) {
      console::setLogLocationLevel((LogLocation *)in_stack_fffffffffffffe10,level);
      console::checkLogLocationEnabled(in_stack_fffffffffffffe20);
    }
    in_stack_fffffffffffffe54 = uVar3 & 0xffffff;
    if ((registerSubscriber::loc.logger_enabled_ & 1U) != 0) {
      in_stack_fffffffffffffe54 = CONCAT13(1,(int3)uVar3);
    }
    local_11a = (char)(in_stack_fffffffffffffe54 >> 0x18);
    if (local_11a != '\0') {
      in_stack_fffffffffffffe48 = (XmlRpcValue *)registerSubscriber::loc.logger_;
      in_stack_fffffffffffffe50 = registerSubscriber::loc.level_;
      in_stack_fffffffffffffe10 = (RequesterInfo *)::std::__cxx11::string::c_str();
      level = Debug;
      console::print((FilterBase *)0x0,in_stack_fffffffffffffe48,
                     (Level)(ulong)in_stack_fffffffffffffe50,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp"
                     ,300,
                     "Master::RpcValue miniros::master::Master::registerSubscriber(const std::string &, const std::string &, const std::string &, const std::string &, Connection *)"
                    );
    }
  }
  ::std::__cxx11::string::operator=(local_c0,in_R9);
  MasterHandler::registerSubscriber
            (in_stack_000003d8,in_stack_000003d0,in_stack_000003c8,in_stack_000003c0);
  XmlRpc::XmlRpcValue::Array((int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
  rhs = local_158;
  this_00 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe10,level);
  XmlRpc::XmlRpcValue::operator=(this_00,rhs);
  XmlRpc::XmlRpcValue::XmlRpcValue
            ((XmlRpcValue *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe10,level);
  XmlRpc::XmlRpcValue::operator=
            ((XmlRpcValue *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x5291e1);
  XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)in_stack_fffffffffffffe10,level);
  XmlRpc::XmlRpcValue::operator=
            ((XmlRpcValue *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  ReturnStruct::~ReturnStruct((ReturnStruct *)in_stack_fffffffffffffe10);
  RequesterInfo::~RequesterInfo(in_stack_fffffffffffffe10);
  RVar2._value.asDouble = extraout_RDX.asDouble;
  RVar2._0_8_ = in_RDI;
  return RVar2;
}

Assistant:

Master::RpcValue Master::registerSubscriber(const std::string& caller_id, const std::string& topic,
  const std::string& type, const std::string& caller_api, Connection* connection)
{
  RequesterInfo requesterInfo;
  if (!requesterInfo.assign(caller_id, connection->getfd())) {
    MINIROS_WARN("Failed to read network address of caller %s", caller_id.c_str());
  }
  requesterInfo.callerApi = caller_api;

  ReturnStruct st = m_handler.registerSubscriber(requesterInfo, topic, type);
  RpcValue res = RpcValue::Array(3);
  res[0] = st.statusCode;
  res[1] = st.statusMessage;
  res[2] = st.value;
  return res;
}